

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_reader.h
# Opt level: O1

void MyGame_Example_Monster_sort(MyGame_Example_Monster_mutable_table_t t)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ushort uVar4;
  long lVar5;
  MyGame_Example_Monster_mutable_table_t pMVar6;
  MyGame_Example_Monster_mutable_table_t pMVar7;
  MyGame_Example_Monster_mutable_table_t pMVar8;
  ulong uVar9;
  ulong uVar10;
  MyGame_Example_Any_mutable_union_t u;
  
  do {
    pMVar7 = t;
    if (pMVar7 == (MyGame_Example_Monster_mutable_table_t)0x0) {
      return;
    }
    lVar5 = -(long)*(int *)pMVar7;
    uVar2 = 0;
    if (0x13 < *(ushort *)(pMVar7 + -(long)*(int *)pMVar7)) {
      uVar2 = (uint)*(ushort *)(pMVar7 + lVar5 + 0x12);
    }
    if (uVar2 == 0) {
      bVar1 = 0;
    }
    else {
      bVar1 = pMVar7[uVar2].unused__;
    }
    if (bVar1 == 0) {
LAB_0010c461:
      pMVar6 = (MyGame_Example_Monster_mutable_table_t)0x0;
    }
    else {
      if (*(ushort *)(pMVar7 + -(long)*(int *)pMVar7) < 0x16) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(ushort *)(pMVar7 + lVar5 + 0x14);
      }
      if (uVar4 == 0) goto LAB_0010c461;
      pMVar6 = pMVar7 + (ulong)*(uint *)(pMVar7 + uVar4) + (ulong)uVar4;
    }
    u._1_7_ = 0;
    u.type = bVar1;
    u.value = pMVar6;
    MyGame_Example_Any_sort(u);
    if (*(ushort *)(pMVar7 + -(long)*(int *)pMVar7) < 0x1c) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ushort *)(pMVar7 + (0x1a - (long)*(int *)pMVar7));
    }
    if (uVar4 == 0) {
      pMVar6 = (MyGame_Example_Monster_mutable_table_t)0x0;
    }
    else {
      pMVar6 = pMVar7 + (ulong)*(uint *)(pMVar7 + uVar4) + (ulong)uVar4 + 4;
    }
    if (pMVar6 == (MyGame_Example_Monster_mutable_table_t)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = (ulong)*(uint *)(pMVar6 + -4);
    }
    if (uVar10 != 0) {
      uVar9 = 0;
      pMVar8 = pMVar6;
      do {
        if (pMVar6 == (MyGame_Example_Monster_mutable_table_t)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = (ulong)*(uint *)(pMVar6 + -4);
        }
        if (uVar3 <= uVar9) {
          __assert_fail("flatbuffers_vec_len(vec) > (i) && \"index out of range\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_reader.h"
                        ,0x43a,
                        "MyGame_Example_Monster_table_t MyGame_Example_Monster_vec_at(MyGame_Example_Monster_vec_t, size_t)"
                       );
        }
        MyGame_Example_Monster_sort(pMVar8 + *(uint *)pMVar8);
        uVar9 = uVar9 + 1;
        pMVar8 = pMVar8 + 4;
      } while (uVar10 != uVar9);
    }
    if (*(ushort *)(pMVar7 + -(long)*(int *)pMVar7) < 0x1e) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ushort *)(pMVar7 + (0x1c - (long)*(int *)pMVar7));
    }
    t = (MyGame_Example_Monster_mutable_table_t)0x0;
    if (uVar4 != 0) {
      t = pMVar7 + (ulong)*(uint *)(pMVar7 + uVar4) + (ulong)uVar4;
    }
  } while( true );
}

Assistant:

static void MyGame_Example_Monster_sort(MyGame_Example_Monster_mutable_table_t t)
{
    if (!t) return;
    __flatbuffers_sort_union_field(MyGame_Example_Monster, test, MyGame_Example_Any, t);
    __flatbuffers_sort_table_vector_field_elements(MyGame_Example_Monster, testarrayoftables, MyGame_Example_Monster, t);
    __flatbuffers_sort_table_field(MyGame_Example_Monster, enemy, MyGame_Example_Monster, t);
}